

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void writefv(FILE *f,char *fmt,__va_list_tag *v)

{
  uint uVar1;
  char *pcVar2;
  uint *in_RDX;
  char *in_RSI;
  FILE *in_RDI;
  uchar b_1 [4];
  stbiw_uint32 x_2;
  uchar b [2];
  int x_1;
  uchar x;
  undefined4 *local_80;
  undefined4 *local_68;
  uint *local_50;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  undefined4 local_28;
  undefined1 local_22;
  undefined1 local_21;
  undefined4 local_20;
  undefined1 local_19;
  uint *local_18;
  char *local_10;
  FILE *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while (*local_10 != '\0') {
    pcVar2 = local_10 + 1;
    switch(*local_10) {
    case ' ':
      local_10 = pcVar2;
      break;
    default:
      return;
    case '1':
      uVar1 = *local_18;
      if (uVar1 < 0x29) {
        local_50 = (uint *)((long)(int)uVar1 + *(long *)(local_18 + 4));
        *local_18 = uVar1 + 8;
      }
      else {
        local_50 = *(uint **)(local_18 + 2);
        *(uint **)(local_18 + 2) = local_50 + 2;
      }
      local_19 = (undefined1)*local_50;
      local_10 = pcVar2;
      fputc(*local_50 & 0xff,local_8);
      break;
    case '2':
      uVar1 = *local_18;
      if (uVar1 < 0x29) {
        local_68 = (undefined4 *)((long)(int)uVar1 + *(long *)(local_18 + 4));
        *local_18 = uVar1 + 8;
      }
      else {
        local_68 = *(undefined4 **)(local_18 + 2);
        *(undefined4 **)(local_18 + 2) = local_68 + 2;
      }
      local_20 = *local_68;
      local_22 = (undefined1)local_20;
      local_21 = (undefined1)((uint)local_20 >> 8);
      local_10 = pcVar2;
      fwrite(&local_22,2,1,local_8);
      break;
    case '4':
      uVar1 = *local_18;
      if (uVar1 < 0x29) {
        local_80 = (undefined4 *)((long)(int)uVar1 + *(long *)(local_18 + 4));
        *local_18 = uVar1 + 8;
      }
      else {
        local_80 = *(undefined4 **)(local_18 + 2);
        *(undefined4 **)(local_18 + 2) = local_80 + 2;
      }
      local_28 = *local_80;
      local_2c = (undefined1)local_28;
      local_2b = (undefined1)((uint)local_28 >> 8);
      local_2a = (undefined1)((uint)local_28 >> 0x10);
      local_29 = (undefined1)((uint)local_28 >> 0x18);
      local_10 = pcVar2;
      fwrite(&local_2c,4,1,local_8);
    }
  }
  return;
}

Assistant:

static void writefv(FILE *f, const char *fmt, va_list v)
{
   while (*fmt) {
      switch (*fmt++) {
         case ' ': break;
         case '1': { unsigned char x = (unsigned char) va_arg(v, int); fputc(x,f); break; }
         case '2': { int x = va_arg(v,int); unsigned char b[2];
                     b[0] = (unsigned char) x; b[1] = (unsigned char) (x>>8);
                     fwrite(b,2,1,f); break; }
         case '4': { stbiw_uint32 x = va_arg(v,int); unsigned char b[4];
                     b[0]=(unsigned char)x; b[1]=(unsigned char)(x>>8);
                     b[2]=(unsigned char)(x>>16); b[3]=(unsigned char)(x>>24);
                     fwrite(b,4,1,f); break; }
         default:
            STBIW_ASSERT(0);
            return;
      }
   }
}